

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

undefined8 fmt::v11::system_error<>(int error_code,format_string<> fmt)

{
  undefined8 in_RDI;
  format_args in_stack_00000000;
  string_view in_stack_00000010;
  monostate *local_70;
  monostate local_68 [16];
  undefined8 local_58;
  monostate *local_50;
  monostate *local_18;
  monostate *local_10;
  
  local_70 = local_68;
  do {
    local_18 = local_70;
    monostate::monostate(local_70);
    local_70 = local_70 + 0x10;
  } while (local_70 != (monostate *)&local_58);
  local_10 = local_68;
  local_58 = 0;
  local_50 = local_10;
  vsystem_error((int)((ulong)&local_58 >> 0x20),in_stack_00000010,in_stack_00000000);
  return in_RDI;
}

Assistant:

auto system_error(int error_code, format_string<T...> fmt, T&&... args)
    -> std::system_error {
  return vsystem_error(error_code, fmt.str, vargs<T...>{{args...}});
}